

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalDiscardTexture(ShaderEvalContext *c)

{
  float *pfVar1;
  int a;
  undefined1 local_60 [8];
  Vector<float,_2> local_58;
  tcu local_50 [8];
  undefined1 local_48 [44];
  undefined1 local_1c [20];
  ShaderEvalContext *c_local;
  
  local_1c._12_8_ = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)c,0,1);
  tcu::Vector<float,_4>::xyz
            ((VecAccess<float,_4,_3> *)(local_48 + 0x10),(Vec4 *)(local_1c._12_8_ + 0x1f0));
  tcu::VecAccess<float,_4,_3>::operator=
            ((VecAccess<float,_4,_3> *)(local_48 + 0x10),(Vector<float,_3> *)local_1c);
  a = (int)local_1c._12_8_;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_60,a,0);
  tcu::operator*((tcu *)&local_58,(Vector<float,_2> *)local_60,0.25);
  tcu::operator+(local_50,&local_58,0.5);
  deqp::gls::ShaderEvalContext::texture2D((ShaderEvalContext *)local_48,a,(Vec2 *)0x0);
  pfVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_48);
  if (*pfVar1 <= 0.7 && *pfVar1 != 0.7) {
    deqp::gls::ShaderEvalContext::discard((ShaderEvalContext *)local_1c._12_8_);
  }
  return;
}

Assistant:

inline void evalDiscardTexture (ShaderEvalContext& c)
{
	c.color.xyz() = c.coords.swizzle(0,1,2);
	if (c.texture2D(0, c.coords.swizzle(0,1) * 0.25f + 0.5f).x() < 0.7f)
		c.discard();
}